

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell.cc
# Opt level: O1

S2Cap * __thiscall S2Cell::GetCapBound(S2Cap *__return_storage_ptr__,S2Cell *this)

{
  ulong uVar1;
  bool bVar2;
  int k;
  int k_00;
  undefined4 uVar3;
  undefined4 uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  S2Point local_38;
  
  dVar5 = ((this->uv_).bounds_[0].bounds_.c_[0] + (this->uv_).bounds_[0].bounds_.c_[1]) * 0.5;
  dVar6 = ((this->uv_).bounds_[1].bounds_.c_[0] + (this->uv_).bounds_[1].bounds_.c_[1]) * 0.5;
  uVar1 = (ulong)DAT_0023a340;
  dVar8 = dVar6;
  switch(this->face_) {
  case '\0':
    dVar8 = 1.0;
    break;
  case '\x01':
    dVar8 = -dVar5;
    dVar5 = 1.0;
    break;
  case '\x02':
    dVar8 = -dVar5;
    dVar5 = -dVar6;
    dVar6 = 1.0;
    break;
  case '\x03':
    dVar8 = -1.0;
    uVar3 = (undefined4)((ulong)dVar5 ^ uVar1);
    uVar4 = (undefined4)(((ulong)dVar5 ^ uVar1) >> 0x20);
    dVar5 = (double)((ulong)dVar6 ^ uVar1);
    goto LAB_001d893b;
  case '\x04':
    uVar3 = (undefined4)((ulong)dVar5 ^ uVar1);
    uVar4 = (undefined4)(((ulong)dVar5 ^ uVar1) >> 0x20);
    dVar5 = -1.0;
LAB_001d893b:
    dVar6 = (double)CONCAT44(uVar4,uVar3);
    break;
  default:
    dVar6 = -1.0;
  }
  dVar7 = dVar6 * dVar6 + dVar5 * dVar5 + dVar8 * dVar8;
  if (dVar7 < 0.0) {
    dVar7 = sqrt(dVar7);
  }
  else {
    dVar7 = SQRT(dVar7);
  }
  dVar7 = (double)(~-(ulong)(dVar7 != 0.0) & (ulong)dVar7 |
                  (ulong)(1.0 / dVar7) & -(ulong)(dVar7 != 0.0));
  S1ChordAngle::S1ChordAngle(&__return_storage_ptr__->radius_,0.0);
  (__return_storage_ptr__->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2Region_002c1748;
  (__return_storage_ptr__->center_).c_[0] = dVar8 * dVar7;
  (__return_storage_ptr__->center_).c_[1] = dVar5 * dVar7;
  (__return_storage_ptr__->center_).c_[2] = dVar6 * dVar7;
  bVar2 = S2::IsUnitLength(&__return_storage_ptr__->center_);
  if ((bVar2) && ((__return_storage_ptr__->radius_).length2_ <= 4.0)) {
    k_00 = 0;
    do {
      GetVertex(&local_38,this,k_00);
      S2Cap::AddPoint(__return_storage_ptr__,&local_38);
      k_00 = k_00 + 1;
    } while (k_00 != 4);
    return __return_storage_ptr__;
  }
  S2LogMessage::S2LogMessage
            ((S2LogMessage *)&local_38,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cap.h"
             ,0xf5,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_38.c_[1],"Check failed: is_valid() ",0x19);
  abort();
}

Assistant:

S2Cap S2Cell::GetCapBound() const {
  // Use the cell center in (u,v)-space as the cap axis.  This vector is
  // very close to GetCenter() and faster to compute.  Neither one of these
  // vectors yields the bounding cap with minimal surface area, but they
  // are both pretty close.
  //
  // It's possible to show that the two vertices that are furthest from
  // the (u,v)-origin never determine the maximum cap size (this is a
  // possible future optimization).

  S2Point center = S2::FaceUVtoXYZ(face_, uv_.GetCenter()).Normalize();
  S2Cap cap = S2Cap::FromPoint(center);
  for (int k = 0; k < 4; ++k) {
    cap.AddPoint(GetVertex(k));
  }
  return cap;
}